

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Iterator * __thiscall
leveldb::Version::NewConcatenatingIterator(Version *this,ReadOptions *options,int level)

{
  long lVar1;
  VersionSet *pVVar2;
  Iterator *pIVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar3 = (Iterator *)operator_new(0x58);
  pVVar2 = this->vset_;
  Iterator::Iterator(pIVar3);
  pIVar3->_vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_013e25d0;
  pIVar3[1]._vptr_Iterator = (_func_int **)&PTR__Comparator_013e2470;
  pIVar3[1].cleanup_head_.function = (CleanupFunction)(pVVar2->icmp_).user_comparator_;
  pIVar3[1].cleanup_head_.arg1 = this->files_ + level;
  *(int *)&pIVar3[1].cleanup_head_.arg2 =
       (int)((ulong)((long)this->files_[level].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)this->files_[level].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pIVar3 = NewTwoLevelIterator(pIVar3,GetFileIterator,this->vset_->table_cache_,options);
    return pIVar3;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* Version::NewConcatenatingIterator(const ReadOptions& options,
                                            int level) const {
  return NewTwoLevelIterator(
      new LevelFileNumIterator(vset_->icmp_, &files_[level]), &GetFileIterator,
      vset_->table_cache_, options);
}